

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

bool xmrig::OclLib::load(void)

{
  int iVar1;
  runtime_error *prVar2;
  exception *ex;
  
  iVar1 = uv_dlsym(&oclLib,kCreateCommandQueue,&pCreateCommandQueue);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateContext,&pCreateContext);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kBuildProgram,&pBuildProgram);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kEnqueueNDRangeKernel,&pEnqueueNDRangeKernel);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kEnqueueReadBuffer,&pEnqueueReadBuffer);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kEnqueueWriteBuffer,&pEnqueueWriteBuffer);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kFinish,&pFinish);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetDeviceIDs,&pGetDeviceIDs);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetDeviceInfo,&pGetDeviceInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetPlatformInfo,&pGetPlatformInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetPlatformIDs,&pGetPlatformIDs);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetProgramBuildInfo,&pGetProgramBuildInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetProgramInfo,&pGetProgramInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kSetKernelArg,&pSetKernelArg);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateKernel,&pCreateKernel);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateBuffer,&pCreateBuffer);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateProgramWithBinary,&pCreateProgramWithBinary);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateProgramWithSource,&pCreateProgramWithSource);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseMemObject,&pReleaseMemObject);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseProgram,&pReleaseProgram);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseKernel,&pReleaseKernel);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseCommandQueue,&pReleaseCommandQueue);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseContext,&pReleaseContext);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetKernelInfo,&pGetKernelInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetCommandQueueInfo,&pGetCommandQueueInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetMemObjectInfo,&pGetMemObjectInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kGetContextInfo,&pGetContextInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kReleaseDevice,&pReleaseDevice);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kUnloadPlatformCompiler,&pUnloadPlatformCompiler);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kSetMemObjectDestructorCallback,&pSetMemObjectDestructorCallback);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kCreateSubBuffer,&pCreateSubBuffer);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kRetainProgram,&pRetainProgram);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(&oclLib,kRetainMemObject,&pRetainMemObject);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,::kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uv_dlsym(&oclLib,kCreateCommandQueueWithProperties,&pCreateCommandQueueWithProperties);
  return true;
}

Assistant:

bool xmrig::OclLib::load()
{
    try {
        DLSYM(CreateCommandQueue);
        DLSYM(CreateContext);
        DLSYM(BuildProgram);
        DLSYM(EnqueueNDRangeKernel);
        DLSYM(EnqueueReadBuffer);
        DLSYM(EnqueueWriteBuffer);
        DLSYM(Finish);
        DLSYM(GetDeviceIDs);
        DLSYM(GetDeviceInfo);
        DLSYM(GetPlatformInfo);
        DLSYM(GetPlatformIDs);
        DLSYM(GetProgramBuildInfo);
        DLSYM(GetProgramInfo);
        DLSYM(SetKernelArg);
        DLSYM(CreateKernel);
        DLSYM(CreateBuffer);
        DLSYM(CreateProgramWithBinary);
        DLSYM(CreateProgramWithSource);
        DLSYM(ReleaseMemObject);
        DLSYM(ReleaseProgram);
        DLSYM(ReleaseKernel);
        DLSYM(ReleaseCommandQueue);
        DLSYM(ReleaseContext);
        DLSYM(GetKernelInfo);
        DLSYM(GetCommandQueueInfo);
        DLSYM(GetMemObjectInfo);
        DLSYM(GetContextInfo);
        DLSYM(ReleaseDevice);
        DLSYM(UnloadPlatformCompiler);
        DLSYM(SetMemObjectDestructorCallback);
        DLSYM(CreateSubBuffer);
        DLSYM(RetainProgram);
        DLSYM(RetainMemObject);
    } catch (std::exception &ex) {
        return false;
    }

#   if defined(CL_VERSION_2_0)
    uv_dlsym(&oclLib, kCreateCommandQueueWithProperties, reinterpret_cast<void**>(&pCreateCommandQueueWithProperties));
#   endif

    return true;
}